

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltextureglyphcache_p.h
# Opt level: O1

void __thiscall
QOpenGLGlyphTexture::QOpenGLGlyphTexture(QOpenGLGlyphTexture *this,QOpenGLContext *ctx)

{
  QOpenGLContextGroup *pQVar1;
  long in_FS_OFFSET;
  long local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (QOpenGLContextGroup *)QOpenGLContext::shareGroup();
  QOpenGLSharedResource::QOpenGLSharedResource(&this->super_QOpenGLSharedResource,pQVar1);
  *(undefined ***)this = &PTR__QOpenGLSharedResource_001a2510;
  this->m_width = 0;
  this->m_height = 0;
  if (*(char *)(*(long *)(ctx + 8) + 0xfc) == '\0') {
    QOpenGLFunctions::QOpenGLFunctions((QOpenGLFunctions *)&local_28,ctx);
    (**(code **)(local_28 + 0x268))(1,&this->m_fbo);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

explicit QOpenGLGlyphTexture(QOpenGLContext *ctx)
        : QOpenGLSharedResource(ctx->shareGroup())
        , m_width(0)
        , m_height(0)
    {
        if (!ctx->d_func()->workaround_brokenFBOReadBack)
            QOpenGLFunctions(ctx).glGenFramebuffers(1, &m_fbo);

#ifdef QT_GL_TEXTURE_GLYPH_CACHE_DEBUG
        qDebug(" -> QOpenGLGlyphTexture() %p for context %p.", this, ctx);
#endif
    }